

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_connection.c
# Opt level: O1

char * AMQP_CONNECTION_STATEStrings(AMQP_CONNECTION_STATE value)

{
  if (AMQP_CONNECTION_STATE_CLOSED < value) {
    return "NULL";
  }
  return AMQP_CONNECTION_STATEStringStorage[value];
}

Assistant:

static int create_sasl_components(AMQP_CONNECTION_INSTANCE* instance)
{
    int result;
    SASL_MECHANISM_HANDLE sasl_mechanism;
    XIO_HANDLE sasl_io;

    if ((sasl_mechanism = saslmechanism_create(saslmssbcbs_get_interface(), NULL)) == NULL)
    {
        LogError("Failed creating the SASL mechanism (saslmechanism_create failed)");
        result = MU_FAILURE;
    }
    else
    {
        SASLCLIENTIO_CONFIG sasl_client_config;
        sasl_client_config.sasl_mechanism = sasl_mechanism;
        sasl_client_config.underlying_io = instance->underlying_io_transport;

        if ((sasl_io = xio_create(saslclientio_get_interface_description(), &sasl_client_config)) == NULL)
        {
            LogError("Failed creating the SASL I/O (xio_create failed)");
            saslmechanism_destroy(sasl_mechanism);
            result = MU_FAILURE;
        }
        else if (xio_setoption(sasl_io, SASL_IO_OPTION_LOG_TRACE, (const void*)&instance->is_trace_on) != RESULT_OK)
        {
            LogError("Failed setting the SASL I/O logging trace option (xio_setoption failed)");
            xio_destroy(sasl_io);
            saslmechanism_destroy(sasl_mechanism);
            result = MU_FAILURE;
        }
        else
        {
            instance->sasl_mechanism = sasl_mechanism;
            instance->sasl_io = sasl_io;
            result = RESULT_OK;
        }
    }

    return result;
}